

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Value.cpp
# Opt level: O0

double __thiscall ODDLParser::Value::getDouble(Value *this)

{
  undefined4 uStack_24;
  double tmp;
  double v;
  Value *this_local;
  
  if (this->m_type == ddl_double) {
    v = (double)this;
    memcpy(&tmp,this->m_data,this->m_size);
    this_local = (Value *)(double)(float)tmp;
  }
  else {
    this_local = (Value *)CONCAT44(uStack_24,*(undefined4 *)this->m_data);
  }
  return (double)this_local;
}

Assistant:

double Value::getDouble() const {
    if ( m_type == ddl_double ) {
        double v;
        ::memcpy( &v, m_data, m_size );
        return ( float ) v;
    }
    else {
        double tmp;
        ::memcpy( &tmp, m_data, 4 );
        return ( double ) tmp;
    }
}